

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::stream_best(SSPMSolver *this,ostream *out,int h)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (*this->best_d == -1) {
    pcVar2 = " \x1b[1;33mTop\x1b[m";
    lVar1 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (0 < h) {
      iVar4 = 0;
      iVar5 = 0;
      do {
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        if (iVar5 < this->l) {
          lVar1 = (long)iVar5;
          iVar3 = 0;
          do {
            if (this->best_d[lVar1] != iVar4) {
              iVar5 = iVar5 - iVar3;
              if (iVar3 == 0) goto LAB_0016e4cf;
              goto LAB_0016e4e3;
            }
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar1 = lVar1 + 1;
            iVar3 = iVar3 + -1;
          } while (lVar1 < this->l);
          iVar5 = iVar5 - iVar3;
        }
        else {
LAB_0016e4cf:
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_2760d5,2);
        }
LAB_0016e4e3:
        iVar4 = iVar4 + 1;
      } while (iVar4 != h);
    }
    pcVar2 = " }";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  return;
}

Assistant:

void
SSPMSolver::stream_best(std::ostream &out, int h)
{
    if (best_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and best_d[j] == i) {
                c++;
                out << best_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}